

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

mi_slice_t * mi_segment_page_clear(mi_page_t *page,mi_segments_tld_t *tld)

{
  _Bool _Var1;
  mi_segment_t *slice_00;
  mi_stat_count_t *stat;
  size_t sVar2;
  mi_segments_tld_t *tld_00;
  mi_slice_t *pmVar3;
  mi_page_t *in_RDI;
  mi_slice_t *slice;
  ptrdiff_t ofs;
  uint8_t heap_tag;
  uint8_t *start;
  size_t psize;
  size_t inuse;
  mi_segment_t *segment;
  size_t in_stack_ffffffffffffffa8;
  size_t *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  uint8_t uVar4;
  mi_segment_t *in_stack_ffffffffffffffd0;
  
  slice_00 = _mi_ptr_segment(in_RDI);
  stat = (mi_stat_count_t *)(ulong)in_RDI->capacity;
  sVar2 = mi_page_block_size(in_RDI);
  tld_00 = (mi_segments_tld_t *)((long)stat * sVar2);
  _mi_stat_decrease(stat,in_stack_ffffffffffffffa8);
  _mi_stat_decrease(stat,in_stack_ffffffffffffffa8);
  if (((slice_00->allow_decommit & 1U) != 0) &&
     (_Var1 = mi_option_is_enabled(mi_option_show_errors), _Var1)) {
    _mi_segment_page_start
              (in_stack_ffffffffffffffd0,
               (mi_page_t *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
    _mi_os_reset((void *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                 (size_t)in_stack_ffffffffffffffc0);
  }
  in_RDI->field_0x8 = in_RDI->field_0x8 & 0xfd;
  uVar4 = in_RDI->heap_tag;
  _mi_memzero(stat,in_stack_ffffffffffffffa8);
  in_RDI->block_size = 1;
  in_RDI->heap_tag = uVar4;
  mi_page_to_slice(in_RDI);
  pmVar3 = mi_segment_span_free_coalesce((mi_slice_t *)slice_00,tld_00);
  slice_00->used = slice_00->used - 1;
  return pmVar3;
}

Assistant:

static mi_slice_t* mi_segment_page_clear(mi_page_t* page, mi_segments_tld_t* tld) {
  mi_assert_internal(page->block_size > 0);
  mi_assert_internal(mi_page_all_free(page));
  mi_segment_t* segment = _mi_ptr_segment(page);
  mi_assert_internal(segment->used > 0);

  size_t inuse = page->capacity * mi_page_block_size(page);
  _mi_stat_decrease(&tld->stats->page_committed, inuse);
  _mi_stat_decrease(&tld->stats->pages, 1);

  // reset the page memory to reduce memory pressure?
  if (segment->allow_decommit && mi_option_is_enabled(mi_option_deprecated_page_reset)) {
    size_t psize;
    uint8_t* start = _mi_segment_page_start(segment, page, &psize);
    _mi_os_reset(start, psize);
  }

  // zero the page data, but not the segment fields and heap tag
  page->is_zero_init = false;
  uint8_t heap_tag = page->heap_tag;
  ptrdiff_t ofs = offsetof(mi_page_t, capacity);
  _mi_memzero((uint8_t*)page + ofs, sizeof(*page) - ofs);
  page->block_size = 1;
  page->heap_tag = heap_tag;

  // and free it
  mi_slice_t* slice = mi_segment_span_free_coalesce(mi_page_to_slice(page), tld);
  segment->used--;
  // cannot assert segment valid as it is called during reclaim
  // mi_assert_expensive(mi_segment_is_valid(segment, tld));
  return slice;
}